

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O1

NativePath * __thiscall
QTemporaryFileName::generateNext(NativePath *__return_storage_ptr__,QTemporaryFileName *this)

{
  Data *pDVar1;
  long lVar2;
  bool bVar3;
  QRandomGenerator *this_00;
  quint64 qVar4;
  char *pcVar5;
  char cVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  
  pDVar1 = (this->path).d.d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
    QByteArray::reallocData(&this->path,(this->path).d.size,KeepSize);
  }
  lVar2 = this->length;
  if (lVar2 != 0) {
    pcVar8 = (this->path).d.ptr + this->pos;
    this_00 = &QRandomGenerator64::global()->super_QRandomGenerator;
    pcVar9 = pcVar8 + lVar2;
    do {
      qVar4 = QRandomGenerator::_fillRange(this_00,(void *)0x0,1);
      uVar7 = (uint)qVar4 & 0x3ff;
      pcVar5 = pcVar9 + -1;
      cVar6 = 'G';
      if (uVar7 < 0x200) {
        cVar6 = 'A';
      }
      pcVar9[-1] = cVar6 + (char)(uVar7 * 0x34 >> 10);
      bVar3 = true;
      if (pcVar5 != pcVar8) {
        uVar7 = (uint)(qVar4 >> 10) & 0x3ff;
        cVar6 = 'G';
        if (uVar7 < 0x200) {
          cVar6 = 'A';
        }
        pcVar5 = pcVar9 + -2;
        pcVar9[-2] = cVar6 + (char)(uVar7 * 0x34 >> 10);
        if (pcVar5 != pcVar8) {
          uVar7 = (uint)qVar4 >> 0x14 & 0x3ff;
          cVar6 = 'G';
          if (uVar7 < 0x200) {
            cVar6 = 'A';
          }
          pcVar5 = pcVar9 + -3;
          pcVar9[-3] = cVar6 + (char)(uVar7 * 0x34 >> 10);
          bVar3 = false;
        }
      }
    } while ((!bVar3) && (pcVar9 = pcVar5, pcVar5 != pcVar8));
  }
  pDVar1 = (this->path).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (this->path).d.ptr;
  (__return_storage_ptr__->d).size = (this->path).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QFileSystemEntry::NativePath QTemporaryFileName::generateNext()
{
    Q_ASSERT(length != 0);
    Q_ASSERT(pos < path.size());
    Q_ASSERT(length <= path.size() - pos);

    Char *const placeholderStart = (Char *)path.data() + pos;
    Char *const placeholderEnd = placeholderStart + length;

    // Replace placeholder with random chars.
    {
        // Since our dictionary is 26+26 characters, it would seem we only need
        // a random number from 0 to 63 to select a character. However, due to
        // the limited range, that would mean 12 (64-52) characters have double
        // the probability of the others: 1 in 32 instead of 1 in 64.
        //
        // To overcome this limitation, we use more bits per character. With 10
        // bits, there are 16 characters with probability 19/1024 and the rest
        // at 20/1024 (i.e, less than .1% difference). This allows us to do 3
        // characters per 32-bit random number, which is also half the typical
        // placeholder length.
        enum { BitsPerCharacter = 10 };

        Char *rIter = placeholderEnd;
        while (rIter != placeholderStart) {
            quint32 rnd = QRandomGenerator::global()->generate();
            auto applyOne = [&]() {
                quint32 v = rnd & ((1 << BitsPerCharacter) - 1);
                rnd >>= BitsPerCharacter;
                char ch = char((26 + 26) * v / (1 << BitsPerCharacter));
                if (ch < 26)
                    *--rIter = Latin1Char(ch + 'A');
                else
                    *--rIter = Latin1Char(ch - 26 + 'a');
            };

            applyOne();
            if (rIter == placeholderStart)
                break;

            applyOne();
            if (rIter == placeholderStart)
                break;

            applyOne();
        }
    }

    return path;
}